

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_proxy.cpp
# Opt level: O0

void __thiscall TcpProxy::TcpProxy(TcpProxy *this,EventLoopGroup *group,string *listenport)

{
  string *host;
  allocator local_51;
  string local_50;
  undefined1 local_30 [24];
  string *listenport_local;
  EventLoopGroup *group_local;
  TcpProxy *this_local;
  
  this->group_ = group;
  local_30._16_8_ = listenport;
  listenport_local = (string *)group;
  group_local = (EventLoopGroup *)this;
  std::shared_ptr<Liby::TcpServer>::shared_ptr(&this->proxyServer_);
  host = listenport_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"localhost",&local_51);
  Liby::EventLoopGroup::creatTcpServer((EventLoopGroup *)local_30,host,&local_50);
  std::shared_ptr<Liby::TcpServer>::operator=
            (&this->proxyServer_,(shared_ptr<Liby::TcpServer> *)local_30);
  std::shared_ptr<Liby::TcpServer>::~shared_ptr((shared_ptr<Liby::TcpServer> *)local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

TcpProxy(EventLoopGroup &group, const std::string &listenport)
        : group_(group) {
        proxyServer_ = group.creatTcpServer("localhost", listenport);
    }